

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_column_reader.cpp
# Opt level: O2

void __thiscall
duckdb::ExpressionColumnReader::ExpressionColumnReader
          (ExpressionColumnReader *this,ClientContext *context,
          unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>
          *child_reader_p,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr_p,
          unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
          *expression_schema_p)

{
  pointer pCVar1;
  ParquetReader *reader;
  type schema_p;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_61;
  LogicalType local_60 [24];
  vector<duckdb::LogicalType,_true> intermediate_types;
  
  pCVar1 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->(child_reader_p);
  reader = ColumnReader::Reader(pCVar1);
  schema_p = unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>,_true>
             ::operator*(expression_schema_p);
  ColumnReader::ColumnReader(&this->super_ColumnReader,reader,schema_p);
  (this->super_ColumnReader)._vptr_ColumnReader =
       (_func_int **)&PTR__ExpressionColumnReader_004df630;
  (this->cast_schema).
  super_unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ParquetColumnSchema_*,_std::default_delete<duckdb::ParquetColumnSchema>_>
  .super__Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false>._M_head_impl =
       (ParquetColumnSchema *)0x0;
  (this->child_reader).
  super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
  super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
  super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl =
       (child_reader_p->
       super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)._M_t.
       super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
       super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl;
  (child_reader_p->
  super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)._M_t.
  super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>.
  super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl = (ColumnReader *)0x0;
  duckdb::DataChunk::DataChunk(&this->intermediate_chunk);
  (this->expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (expr_p->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t
       .super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (expr_p->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
  duckdb::ExpressionExecutor::ExpressionExecutor
            (&this->executor,context,
             (this->expr).
             super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl);
  (this->expression_schema).
  super_unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ParquetColumnSchema_*,_std::default_delete<duckdb::ParquetColumnSchema>_>
  .super__Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false>._M_head_impl =
       (expression_schema_p->
       super_unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParquetColumnSchema_*,_std::default_delete<duckdb::ParquetColumnSchema>_>
       .super__Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false>._M_head_impl;
  (expression_schema_p->
  super_unique_ptr<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>).
  _M_t.
  super___uniq_ptr_impl<duckdb::ParquetColumnSchema,_std::default_delete<duckdb::ParquetColumnSchema>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ParquetColumnSchema_*,_std::default_delete<duckdb::ParquetColumnSchema>_>
  .super__Head_base<0UL,_duckdb::ParquetColumnSchema_*,_false>._M_head_impl =
       (ParquetColumnSchema *)0x0;
  pCVar1 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
           operator->(&this->child_reader);
  duckdb::LogicalType::LogicalType(local_60,&pCVar1->column_schema->type);
  __l._M_len = 1;
  __l._M_array = local_60;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&intermediate_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__l,&local_61)
  ;
  duckdb::LogicalType::~LogicalType(local_60);
  duckdb::DataChunk::Initialize
            ((Allocator *)&this->intermediate_chunk,
             (vector *)((this->super_ColumnReader).reader)->allocator,(ulong)&intermediate_types);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&intermediate_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  return;
}

Assistant:

ExpressionColumnReader::ExpressionColumnReader(ClientContext &context, unique_ptr<ColumnReader> child_reader_p,
                                               unique_ptr<Expression> expr_p,
                                               unique_ptr<ParquetColumnSchema> expression_schema_p)
    : ColumnReader(child_reader_p->Reader(), *expression_schema_p), child_reader(std::move(child_reader_p)),
      expr(std::move(expr_p)), executor(context, expr.get()), expression_schema(std::move(expression_schema_p)) {
	vector<LogicalType> intermediate_types {child_reader->Type()};
	intermediate_chunk.Initialize(reader.allocator, intermediate_types);
}